

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O3

_Bool read_RGB_paletted_image
                (ALLEGRO_FILE *f,int flags,BMPINFOHEADER *infoheader,PalEntry *pal,
                ALLEGRO_LOCKED_REGION *lr,bmp_line_fn fn)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  undefined4 in_register_00000034;
  ulong *puVar13;
  int iVar14;
  
  puVar13 = (ulong *)CONCAT44(in_register_00000034,flags);
  uVar2 = (uint)puVar13[1];
  uVar3 = *puVar13;
  uVar6 = (uint)uVar3;
  uVar1 = (ushort)puVar13[2];
  if (uVar1 < 8) {
    uVar12 = (uint)(byte)(8 / (uVar1 & 0xff));
  }
  else {
    uVar12 = (uint)(uVar1 >> 3);
  }
  lVar8 = al_malloc_with_context
                    (((long)(int)(uVar6 + 3) & 0xfffffffffffffffcU) * (ulong)uVar12,0x2e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
                     ,"read_RGB_paletted_image");
  if (lVar8 == 0) {
    cVar5 = _al_trace_prefix("image",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
                             ,0x2e3,"read_RGB_paletted_image");
    if (cVar5 != '\0') {
      _al_trace_suffix("Failed to allocate pixel row buffer\n");
    }
  }
  else {
    if (uVar2 != 0) {
      iVar14 = uVar2 - 1;
      uVar12 = 0;
      if ((int)uVar2 < 0) {
        iVar14 = 0;
      }
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      do {
        lVar10 = *(long *)pal;
        lVar9 = (long)(pal->a * iVar14);
        (*(code *)lr)(f,lVar8,lVar10 + lVar9,uVar3 & 0xffffffff,0);
        if (0 < (int)uVar6) {
          lVar10 = lVar10 + lVar9;
          uVar11 = 0;
          do {
            uVar4 = (ulong)*(byte *)(lVar8 + uVar11);
            *(char *)(lVar10 + uVar11 * 4) = (char)(&infoheader->biWidth)[uVar4 * 2];
            *(undefined1 *)(lVar10 + 1 + uVar11 * 4) =
                 *(undefined1 *)((long)&infoheader->biWidth + uVar4 * 0x10 + 4);
            *(char *)(lVar10 + 2 + uVar11 * 4) = (char)(&infoheader->biHeight)[uVar4 * 2];
            *(undefined1 *)(lVar10 + 3 + uVar11 * 4) =
                 *(undefined1 *)((long)&infoheader->biHeight + uVar4 * 0x10 + 4);
            uVar11 = uVar11 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar11);
        }
        uVar12 = uVar12 + 1;
        iVar14 = iVar14 + ((int)~uVar2 >> 0x1f | 1U);
      } while (uVar12 != uVar7);
    }
    al_free_with_context
              (lVar8,0x2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
               ,"read_RGB_paletted_image");
  }
  return lVar8 != 0;
}

Assistant:

static bool read_RGB_paletted_image(ALLEGRO_FILE *f, int flags,
   const BMPINFOHEADER *infoheader, PalEntry* pal,
   ALLEGRO_LOCKED_REGION *lr, bmp_line_fn fn)
{
   int i, j, line, height, width, dir;
   size_t linesize;
   char *linebuf;

   (void)flags;

   height = infoheader->biHeight;
   width = infoheader->biWidth;

   // Includes enough space to read the padding for a line
   linesize = (width + 3) & ~3;

   if (infoheader->biBitCount < 8)
      linesize *= (8 / infoheader->biBitCount);
   else
      linesize *= (infoheader->biBitCount / 8);

   linebuf = al_malloc(linesize);

   if (!linebuf) {
      ALLEGRO_WARN("Failed to allocate pixel row buffer\n");
      return false;
   }

   line = height < 0 ? 0 : height - 1;
   dir = height < 0 ? 1 : -1;
   height = abs(height);

   for (i = 0; i < height; i++, line += dir) {
      char *data = (char *)lr->data + lr->pitch * line;
      fn(f, linebuf, data, width, false);

      for (j = 0; j < width; ++j) {
         unsigned char idx = linebuf[j];
         data[j*4]   = pal[idx].r;
         data[j*4+1] = pal[idx].g;
         data[j*4+2] = pal[idx].b;
         data[j*4+3] = pal[idx].a;
      }
   }

   al_free(linebuf);

   return true;
}